

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O0

Dec_Graph_t *
Rwt_CutEvaluate(Ivy_Man_t *pMan,Rwt_Man_t *p,Ivy_Obj_t *pRoot,Vec_Ptr_t *vFaninsCur,int nNodesSaved,
               int LevelMax,int *pGainBest,uint uTruth)

{
  Dec_Graph_t *pGraph;
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  Dec_Node_t *pDVar3;
  int local_70;
  int local_6c;
  int k;
  int i;
  int GainBest;
  int nNodesAdded;
  Rwt_Node_t *pFanin;
  Rwt_Node_t *pNode;
  Dec_Graph_t *pGraphCur;
  Dec_Graph_t *pGraphBest;
  Vec_Ptr_t *vSubgraphs;
  int LevelMax_local;
  int nNodesSaved_local;
  Vec_Ptr_t *vFaninsCur_local;
  Ivy_Obj_t *pRoot_local;
  Rwt_Man_t *p_local;
  Ivy_Man_t *pMan_local;
  
  pGraphCur = (Dec_Graph_t *)0x0;
  p_00 = Vec_VecEntry(p->vClasses,(uint)p->pMap[uTruth]);
  p->nSubgraphs = p_00->nSize + p->nSubgraphs;
  k = -1;
  local_6c = 0;
  do {
    iVar1 = Vec_PtrSize(p_00);
    if (iVar1 <= local_6c) {
      if (k == -1) {
        pMan_local = (Ivy_Man_t *)0x0;
      }
      else {
        *pGainBest = k;
        pMan_local = (Ivy_Man_t *)pGraphCur;
      }
      return (Dec_Graph_t *)pMan_local;
    }
    pvVar2 = Vec_PtrEntry(p_00,local_6c);
    pGraph = *(Dec_Graph_t **)((long)pvVar2 + 0x20);
    for (local_70 = 0; iVar1 = Vec_PtrSize(vFaninsCur), local_70 < iVar1; local_70 = local_70 + 1) {
      pvVar2 = Vec_PtrEntry(vFaninsCur,local_70);
      pDVar3 = Dec_GraphNode(pGraph,local_70);
      (pDVar3->field_2).pFunc = pvVar2;
    }
    iVar1 = Ivy_GraphToNetworkCount(pMan,pRoot,pGraph,nNodesSaved,LevelMax);
    if (iVar1 != -1) {
      if (nNodesSaved < iVar1) {
        __assert_fail("nNodesSaved >= nNodesAdded",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyRwr.c"
                      ,0x180,
                      "Dec_Graph_t *Rwt_CutEvaluate(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, int, int, int *, unsigned int)"
                     );
      }
      if (k < nNodesSaved - iVar1) {
        k = nNodesSaved - iVar1;
        pGraphCur = pGraph;
      }
    }
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

Dec_Graph_t * Rwt_CutEvaluate( Ivy_Man_t * pMan, Rwt_Man_t * p, Ivy_Obj_t * pRoot, Vec_Ptr_t * vFaninsCur, int nNodesSaved, int LevelMax, int * pGainBest, unsigned uTruth )
{
    Vec_Ptr_t * vSubgraphs;
    Dec_Graph_t * pGraphBest = NULL; // Suppress "might be used uninitialized"
    Dec_Graph_t * pGraphCur;
    Rwt_Node_t * pNode, * pFanin;
    int nNodesAdded, GainBest, i, k;
    // find the matching class of subgraphs
    vSubgraphs = Vec_VecEntry( p->vClasses, p->pMap[uTruth] );
    p->nSubgraphs += vSubgraphs->nSize;
    // determine the best subgraph
    GainBest = -1;
    Vec_PtrForEachEntry( Rwt_Node_t *, vSubgraphs, pNode, i )
    {
        // get the current graph
        pGraphCur = (Dec_Graph_t *)pNode->pNext;
        // copy the leaves
        Vec_PtrForEachEntry( Rwt_Node_t *, vFaninsCur, pFanin, k )
            Dec_GraphNode(pGraphCur, k)->pFunc = pFanin;
        // detect how many unlabeled nodes will be reused
        nNodesAdded = Ivy_GraphToNetworkCount( pMan, pRoot, pGraphCur, nNodesSaved, LevelMax );
        if ( nNodesAdded == -1 )
            continue;
        assert( nNodesSaved >= nNodesAdded );
        // count the gain at this node
        if ( GainBest < nNodesSaved - nNodesAdded )
        {
            GainBest   = nNodesSaved - nNodesAdded;
            pGraphBest = pGraphCur;
        }
    }
    if ( GainBest == -1 )
        return NULL;
    *pGainBest = GainBest;
    return pGraphBest;
}